

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

REStackFrame * __thiscall
icu_63::RegexMatcher::StateSave
          (RegexMatcher *this,REStackFrame *fp,int64_t savePatIdx,UErrorCode *status)

{
  UBool UVar1;
  int64_t *piVar2;
  RegexMatcher *pRVar3;
  RegexMatcher *local_48;
  int64_t *dest;
  int64_t *source;
  int64_t *newFP;
  UErrorCode *status_local;
  int64_t savePatIdx_local;
  REStackFrame *fp_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  this_local = (RegexMatcher *)fp;
  if (UVar1 == '\0') {
    this_local = (RegexMatcher *)UVector64::reserveBlock(this->fStack,this->fFrameSize,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      piVar2 = (int64_t *)((long)this_local + (long)this->fFrameSize * -8);
      local_48 = this_local;
      dest = piVar2;
      do {
        pRVar3 = (RegexMatcher *)(dest + 1);
        (local_48->super_UObject)._vptr_UObject = (_func_int **)*dest;
        local_48 = (RegexMatcher *)&local_48->fPattern;
        dest = (int64_t *)pRVar3;
      } while (pRVar3 != this_local);
      this->fTickCounter = this->fTickCounter + -1;
      if (this->fTickCounter < 1) {
        IncrementTime(this,status);
      }
      piVar2[1] = savePatIdx;
    }
    else {
      *status = U_REGEX_STACK_OVERFLOW;
      this_local = (RegexMatcher *)fp;
    }
  }
  return (REStackFrame *)this_local;
}

Assistant:

inline REStackFrame *RegexMatcher::StateSave(REStackFrame *fp, int64_t savePatIdx, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return fp;
    }
    // push storage for a new frame.
    int64_t *newFP = fStack->reserveBlock(fFrameSize, status);
    if (U_FAILURE(status)) {
        // Failure on attempted stack expansion.
        //   Stack function set some other error code, change it to a more
        //   specific one for regular expressions.
        status = U_REGEX_STACK_OVERFLOW;
        // We need to return a writable stack frame, so just return the
        //    previous frame.  The match operation will stop quickly
        //    because of the error status, after which the frame will never
        //    be looked at again.
        return fp;
    }
    fp = (REStackFrame *)(newFP - fFrameSize);  // in case of realloc of stack.

    // New stack frame = copy of old top frame.
    int64_t *source = (int64_t *)fp;
    int64_t *dest   = newFP;
    for (;;) {
        *dest++ = *source++;
        if (source == newFP) {
            break;
        }
    }

    fTickCounter--;
    if (fTickCounter <= 0) {
       IncrementTime(status);    // Re-initializes fTickCounter
    }
    fp->fPatIdx = savePatIdx;
    return (REStackFrame *)newFP;
}